

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfCut.c
# Opt level: O1

Cnf_Cut_t * Cnf_CutCompose(Cnf_Man_t *p,Cnf_Cut_t *pCut,Cnf_Cut_t *pCutFan,int iFan)

{
  Cnf_Cut_t *__dest;
  char cVar1;
  char cVar2;
  char cVar3;
  short sVar4;
  short sVar5;
  int iVar6;
  int iVar7;
  uint *puVar8;
  uint *puVar9;
  uint *pOut;
  Vec_Int_t *pVVar10;
  int iVar11;
  ulong uVar12;
  Cnf_Cut_t *pCVar13;
  Vec_Int_t *pVVar14;
  uint uVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  ulong uVar19;
  long lVar20;
  uint uVar21;
  int *piVar22;
  uint uVar23;
  ulong uVar24;
  bool bVar25;
  
  uVar12 = (ulong)pCut->nFanins;
  bVar25 = 0 < (long)uVar12;
  if (0 < (long)uVar12) {
    puVar8 = p->pTruths[0];
    puVar9 = p->pTruths[2];
    pOut = p->pTruths[3];
    iVar11._0_1_ = pCut[1].nFanins;
    iVar11._1_1_ = pCut[1].Cost;
    iVar11._2_2_ = pCut[1].nWords;
    if (iVar11 == iFan) {
      uVar24 = 0;
    }
    else {
      uVar19 = 0;
      do {
        if (uVar12 - 1 == uVar19) goto LAB_008f0523;
        uVar24 = uVar19 + 1;
        lVar17 = uVar19 * 4;
        uVar19 = uVar24;
      } while (*(int *)((long)pCut[1].vIsop + lVar17 + -4) != iFan);
      bVar25 = uVar24 < uVar12;
    }
    if (bVar25) {
      uVar15 = (uint)uVar24;
      Cnf_CutRemoveIthVar(pCut,uVar15,iFan);
      cVar1 = pCut->nFanins;
      iVar11 = (int)cVar1;
      if (cVar1 < '\x01') {
        iVar18 = 0;
        iVar16 = 0;
        uVar23 = 0;
      }
      else {
        cVar2 = pCutFan->nFanins;
        uVar23 = 0;
        piVar22 = Cnf_CutCompose::pFanins;
        iVar16 = 0;
        iVar18 = 0;
        do {
          if (cVar2 <= iVar16) break;
          iVar6 = *(int *)((long)pCut[1].vIsop + (long)iVar18 * 4 + -8);
          iVar7 = *(int *)((long)pCutFan[1].vIsop + (long)iVar16 * 4 + -8);
          if (iVar6 == iVar7) {
            *piVar22 = iVar6;
            iVar18 = iVar18 + 1;
LAB_008f0012:
            iVar16 = iVar16 + 1;
          }
          else {
            if (iVar7 <= iVar6) {
              *piVar22 = iVar7;
              goto LAB_008f0012;
            }
            *piVar22 = iVar6;
            iVar18 = iVar18 + 1;
          }
          uVar23 = uVar23 + 1;
          piVar22 = piVar22 + 1;
        } while (iVar18 < iVar11);
      }
      lVar17 = (long)iVar11;
      if (iVar18 < iVar11) {
        lVar20 = 0;
        do {
          Cnf_CutCompose::pFanins[lVar20 + (ulong)uVar23] =
               *(int *)((long)pCut[1].vIsop + lVar20 * 4 + (long)iVar18 * 4 + -8);
          lVar20 = lVar20 + 1;
        } while (lVar17 - iVar18 != lVar20);
        uVar23 = uVar23 + (int)lVar20;
      }
      cVar2 = pCutFan->nFanins;
      if (iVar16 < cVar2) {
        lVar20 = 0;
        do {
          Cnf_CutCompose::pFanins[lVar20 + (ulong)uVar23] =
               *(int *)((long)pCutFan[1].vIsop + lVar20 * 4 + (long)iVar16 * 4 + -8);
          lVar20 = lVar20 + 1;
        } while ((long)(int)cVar2 - (long)iVar16 != lVar20);
        uVar23 = uVar23 + (int)lVar20;
      }
      if ((int)uVar23 < p->nMergeLimit) {
        cVar1 = (char)uVar23;
        iVar11 = 1 << (cVar1 - 5U & 0x1f);
        if ((int)uVar23 < 6) {
          iVar11 = 1;
        }
        pCVar13 = (Cnf_Cut_t *)Aig_MmFlexEntryFetch(p->pMemCuts,(uVar23 + iVar11) * 4 + 0x18);
        pCVar13->nFanins = cVar1;
        pCVar13->nWords = (short)iVar11;
        pCVar13->vIsop[0] = (Vec_Int_t *)0x0;
        pCVar13->vIsop[1] = (Vec_Int_t *)0x0;
        __dest = pCVar13 + 1;
        memcpy(__dest,Cnf_CutCompose::pFanins,(long)(int)uVar23 << 2);
        cVar2 = pCut->nFanins;
        cVar3 = pCutFan->nFanins;
        if ((int)cVar3 + (int)cVar2 < (int)cVar1) {
          __assert_fail("pCutRes->nFanins <= pCut->nFanins + pCutFan->nFanins",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfCut.c"
                        ,0x140,
                        "Cnf_Cut_t *Cnf_CutCompose(Cnf_Man_t *, Cnf_Cut_t *, Cnf_Cut_t *, int)");
        }
        sVar4 = pCVar13->nWords;
        if (0 < sVar4) {
          sVar5 = pCut->nWords;
          uVar12 = 0;
          do {
            puVar8[uVar12] =
                 *(uint *)((long)pCut[1].vIsop +
                          ((long)((ulong)(uint)((int)uVar12 >> 0x1f) << 0x20 | uVar12 & 0xffffffff)
                           % (long)(int)sVar5 & 0xffffffffU) * 4 + (long)(int)cVar2 * 4 + -8);
            uVar12 = uVar12 + 1;
          } while ((uint)(sVar4 * 2) != uVar12);
        }
        if (0 < sVar4) {
          sVar5 = pCutFan->nWords;
          uVar12 = 0;
          do {
            puVar9[uVar12] =
                 *(uint *)((long)pCutFan[1].vIsop +
                          ((long)((ulong)(uint)((int)uVar12 >> 0x1f) << 0x20 | uVar12 & 0xffffffff)
                           % (long)(int)sVar5 & 0xffffffffU) * 4 + (long)(int)cVar3 * 4 + -8);
            uVar12 = uVar12 + 1;
          } while ((uint)(int)sVar4 != uVar12);
        }
        iVar11 = (int)pCVar13->nFanins;
        if (0x1f < iVar11) {
          __assert_fail("nBits <= 32",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kit.h"
                        ,0xe4,"unsigned int Kit_BitMask(int)");
        }
        Kit_TruthShrink(pOut,puVar8,iVar11,iVar11 + 1,
                        ~(-1 << ((byte)(iVar11 + 1) & 0x1f) | 1 << (uVar15 & 0x1f)),1);
        cVar2 = pCVar13->nFanins;
        uVar15 = (uint)cVar2;
        uVar23 = 0;
        uVar21 = 0;
        if ('\0' < cVar2) {
          lVar17 = 0;
          iVar11 = 0;
          uVar21 = 0;
          do {
            if (iVar11 == pCut->nFanins) break;
            iVar16 = *(int *)((long)pCut[1].vIsop + (long)iVar11 * 4 + -8);
            iVar18 = *(int *)((long)__dest->vIsop + lVar17 * 4 + -8);
            if (iVar16 <= iVar18) {
              if (iVar18 != iVar16) goto LAB_008f0542;
              uVar21 = uVar21 | 1 << ((uint)lVar17 & 0x1f);
              iVar11 = iVar11 + 1;
            }
            lVar17 = lVar17 + 1;
          } while ((int)uVar15 != lVar17);
        }
        if ('\0' < cVar2) {
          lVar17 = 0;
          iVar11 = 0;
          uVar23 = 0;
          do {
            if (iVar11 == pCutFan->nFanins) break;
            iVar16 = *(int *)((long)pCutFan[1].vIsop + (long)iVar11 * 4 + -8);
            iVar18 = *(int *)((long)__dest->vIsop + lVar17 * 4 + -8);
            if (iVar16 <= iVar18) {
              if (iVar18 != iVar16) {
LAB_008f0542:
                __assert_fail("pCut->pFanins[i] == pCut1->pFanins[k]",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfCut.c"
                              ,0xec,"unsigned int Cnf_TruthPhase(Cnf_Cut_t *, Cnf_Cut_t *)");
              }
              uVar23 = uVar23 | 1 << ((uint)lVar17 & 0x1f);
              iVar11 = iVar11 + 1;
            }
            lVar17 = lVar17 + 1;
          } while ((int)uVar15 != lVar17);
        }
        Kit_TruthStretch(pOut,puVar8,pCut->nFanins + 1,uVar15 + 1,uVar21 | 1 << (uVar15 & 0x1f),1);
        Kit_TruthStretch(pOut,puVar9,(int)pCutFan->nFanins,(int)pCVar13->nFanins,uVar23,1);
        uVar15 = 1 << (pCVar13->nFanins - 5U & 0x1f);
        if (pCVar13->nFanins < '\x06') {
          uVar15 = 1;
        }
        lVar17 = (long)cVar1 * 4 + 0x14;
        if (0 < (int)uVar15) {
          sVar4 = pCVar13->nWords;
          uVar12 = (ulong)uVar15;
          do {
            *(uint *)((long)pCVar13->vIsop + uVar12 * 4 + lVar17 + -8) =
                 (puVar8[(long)sVar4 + (uVar12 - 1)] ^ puVar8[uVar12 - 1]) & puVar9[uVar12 - 1] ^
                 puVar8[uVar12 - 1];
            bVar25 = 1 < (long)uVar12;
            uVar12 = uVar12 - 1;
          } while (bVar25);
        }
        cVar2 = pCut->nFanins;
        lVar20 = (long)cVar2;
        if ((long)uVar24 < lVar20) {
          do {
            *(undefined4 *)((long)pCut[1].vIsop + lVar20 * 4 + -8) =
                 *(undefined4 *)((long)pCut->vIsop + lVar20 * 4 + 0xc);
            lVar20 = lVar20 + -1;
          } while ((long)(uVar24 & 0xffffffff) < lVar20);
        }
        puVar8 = (uint *)((long)__dest->vIsop + (long)cVar1 * 4 + -8);
        *(int *)((long)pCut[1].vIsop + (uVar24 & 0xffffffff) * 4 + -8) = iFan;
        pCut->nFanins = cVar2 + '\x01';
        if (pCVar13->nFanins < 5) {
          pCVar13->Cost =
               p->pSopSizes[(ulong)(ushort)*puVar8 ^ 0xffff] + p->pSopSizes[(ushort)*puVar8];
        }
        else {
          pVVar14 = (Vec_Int_t *)0x0;
          iVar11 = Kit_TruthIsop(puVar8,(int)pCVar13->nFanins,p->vMemory,0);
          if (iVar11 != -1) {
            pVVar10 = p->vMemory;
            pVVar14 = (Vec_Int_t *)malloc(0x10);
            iVar11 = pVVar10->nSize;
            lVar20 = (long)iVar11;
            pVVar14->nSize = iVar11;
            pVVar14->nCap = iVar11;
            if (lVar20 == 0) {
              piVar22 = (int *)0x0;
            }
            else {
              piVar22 = (int *)malloc(lVar20 * 4);
            }
            pVVar14->pArray = piVar22;
            memcpy(piVar22,pVVar10->pArray,lVar20 << 2);
          }
          pCVar13->vIsop[1] = pVVar14;
          cVar1 = pCVar13->nFanins;
          uVar15 = 1 << (cVar1 - 5U & 0x1f);
          if (cVar1 < 6) {
            uVar15 = 1;
          }
          if (0 < (int)uVar15) {
            uVar12 = (ulong)uVar15;
            do {
              puVar9 = (uint *)((long)pCVar13->vIsop + uVar12 * 4 + lVar17 + -8);
              *puVar9 = ~*puVar9;
              bVar25 = 1 < (long)uVar12;
              uVar12 = uVar12 - 1;
            } while (bVar25);
          }
          pVVar14 = (Vec_Int_t *)0x0;
          iVar11 = Kit_TruthIsop(puVar8,(int)cVar1,p->vMemory,0);
          if (iVar11 != -1) {
            pVVar10 = p->vMemory;
            pVVar14 = (Vec_Int_t *)malloc(0x10);
            iVar11 = pVVar10->nSize;
            lVar20 = (long)iVar11;
            pVVar14->nSize = iVar11;
            pVVar14->nCap = iVar11;
            if (lVar20 == 0) {
              piVar22 = (int *)0x0;
            }
            else {
              piVar22 = (int *)malloc(lVar20 * 4);
            }
            pVVar14->pArray = piVar22;
            memcpy(piVar22,pVVar10->pArray,lVar20 << 2);
          }
          pCVar13->vIsop[0] = pVVar14;
          uVar15 = 1 << (pCVar13->nFanins - 5U & 0x1f);
          if (pCVar13->nFanins < '\x06') {
            uVar15 = 1;
          }
          if (0 < (int)uVar15) {
            uVar12 = (ulong)uVar15;
            do {
              puVar8 = (uint *)((long)pCVar13->vIsop + uVar12 * 4 + lVar17 + -8);
              *puVar8 = ~*puVar8;
              bVar25 = 1 < (long)uVar12;
              uVar12 = uVar12 - 1;
            } while (bVar25);
          }
          if (((pVVar14 == (Vec_Int_t *)0x0) || (pCVar13->vIsop[1] == (Vec_Int_t *)0x0)) ||
             (iVar11 = pCVar13->vIsop[1]->nSize + pVVar14->nSize, 0x7f < iVar11)) {
            pCVar13->Cost = '\x7f';
          }
          else {
            pCVar13->Cost = (char)iVar11;
          }
        }
      }
      else {
        if ((int)uVar15 < iVar11) {
          do {
            *(undefined4 *)((long)pCut[1].vIsop + lVar17 * 4 + -8) =
                 *(undefined4 *)((long)pCut->vIsop + lVar17 * 4 + 0xc);
            lVar17 = lVar17 + -1;
          } while ((long)(uVar24 & 0xffffffff) < lVar17);
        }
        *(int *)((long)pCut[1].vIsop + (uVar24 & 0xffffffff) * 4 + -8) = iFan;
        pCut->nFanins = cVar1 + '\x01';
        pCVar13 = (Cnf_Cut_t *)0x0;
      }
      return pCVar13;
    }
  }
LAB_008f0523:
  __assert_fail("iVar < pCut->nFanins",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfCut.c"
                ,0x133,"Cnf_Cut_t *Cnf_CutCompose(Cnf_Man_t *, Cnf_Cut_t *, Cnf_Cut_t *, int)");
}

Assistant:

Cnf_Cut_t * Cnf_CutCompose( Cnf_Man_t * p, Cnf_Cut_t * pCut, Cnf_Cut_t * pCutFan, int iFan )
{
    Cnf_Cut_t * pCutRes;
    static int pFanins[32];
    unsigned * pTruth, * pTruthFan, * pTruthRes;
    unsigned * pTop = p->pTruths[0], * pFan = p->pTruths[2], * pTemp = p->pTruths[3];
    unsigned uPhase, uPhaseFan;
    int i, iVar, nFanins, RetValue;

    // make sure the second cut is the fanin of the first
    for ( iVar = 0; iVar < pCut->nFanins; iVar++ )
        if ( pCut->pFanins[iVar] == iFan )
            break;
    assert( iVar < pCut->nFanins );
    // remove this variable
    Cnf_CutRemoveIthVar( pCut, iVar, iFan );
    // merge leaves of the cuts
    nFanins = Cnf_CutMergeLeaves( pCut, pCutFan, pFanins );
    if ( nFanins+1 > p->nMergeLimit )
    {
        Cnf_CutInsertIthVar( pCut, iVar, iFan );
        return NULL;
    }
    // create new cut
    pCutRes = Cnf_CutAlloc( p, nFanins );
    memcpy( pCutRes->pFanins, pFanins, sizeof(int) * nFanins );
    assert( pCutRes->nFanins <= pCut->nFanins + pCutFan->nFanins );

    // derive its truth table
    // get the truth tables in the composition space
    pTruth    = Cnf_CutTruth(pCut);
    pTruthFan = Cnf_CutTruth(pCutFan);
    pTruthRes = Cnf_CutTruth(pCutRes);
    for ( i = 0; i < 2*pCutRes->nWords; i++ )
        pTop[i] = pTruth[i % pCut->nWords];
    for ( i = 0; i < pCutRes->nWords; i++ )
        pFan[i] = pTruthFan[i % pCutFan->nWords];
    // move the variable to the end
    uPhase = Kit_BitMask( pCutRes->nFanins+1 ) & ~(1 << iVar);
    Kit_TruthShrink( pTemp, pTop, pCutRes->nFanins, pCutRes->nFanins+1, uPhase, 1 );
    // compute the phases
    uPhase    = Cnf_TruthPhase( pCutRes, pCut    ) | (1 << pCutRes->nFanins);
    uPhaseFan = Cnf_TruthPhase( pCutRes, pCutFan );
    // permute truth-tables to the common support
    Kit_TruthStretch( pTemp, pTop, pCut->nFanins+1,  pCutRes->nFanins+1, uPhase,    1 );
    Kit_TruthStretch( pTemp, pFan, pCutFan->nFanins, pCutRes->nFanins,   uPhaseFan, 1 );
    // perform Boolean operation
    Kit_TruthMux( pTruthRes, pTop, pTop+pCutRes->nWords, pFan, pCutRes->nFanins );
    // return the cut to its original condition
    Cnf_CutInsertIthVar( pCut, iVar, iFan );
    // consider the simple case
    if ( pCutRes->nFanins < 5 )
    {
        pCutRes->Cost = p->pSopSizes[0xFFFF & *pTruthRes] + p->pSopSizes[0xFFFF & ~*pTruthRes];
        return pCutRes;
    }

    // derive ISOP for positive phase
    RetValue = Kit_TruthIsop( pTruthRes, pCutRes->nFanins, p->vMemory, 0 );
    pCutRes->vIsop[1] = (RetValue == -1)? NULL : Vec_IntDup( p->vMemory );
    // derive ISOP for negative phase
    Kit_TruthNot( pTruthRes, pTruthRes, pCutRes->nFanins );
    RetValue = Kit_TruthIsop( pTruthRes, pCutRes->nFanins, p->vMemory, 0 );
    pCutRes->vIsop[0] = (RetValue == -1)? NULL : Vec_IntDup( p->vMemory );
    Kit_TruthNot( pTruthRes, pTruthRes, pCutRes->nFanins );

    // compute the cut cost
    if ( pCutRes->vIsop[0] == NULL || pCutRes->vIsop[1] == NULL )
        pCutRes->Cost = 127;
    else if ( Vec_IntSize(pCutRes->vIsop[0]) + Vec_IntSize(pCutRes->vIsop[1]) > 127 )
        pCutRes->Cost = 127;
    else
        pCutRes->Cost = Vec_IntSize(pCutRes->vIsop[0]) + Vec_IntSize(pCutRes->vIsop[1]);
    return pCutRes;
}